

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::
     transform_line_to_triplet<charls::transform_hp1<unsigned_short>::inverse,unsigned_short>
               (unsigned_short *source,size_t pixel_stride_in,triplet<unsigned_short> *destination,
               size_t pixel_stride,inverse *transform)

{
  ushort uVar1;
  unsigned_short uVar2;
  size_t sVar3;
  uint uVar4;
  
  if (pixel_stride_in < pixel_stride) {
    pixel_stride = pixel_stride_in;
  }
  for (sVar3 = 0; pixel_stride != sVar3; sVar3 = sVar3 + 1) {
    uVar1 = source[pixel_stride_in + sVar3];
    uVar2 = source[sVar3];
    (destination->field_2).v3 = source[pixel_stride_in * 2 + sVar3] + uVar1 ^ 0x8000;
    uVar4 = (ushort)(uVar2 + uVar1) ^ 0x8000 | (uint)uVar1 << 0x10;
    destination->field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)(short)uVar4;
    destination->field_1 =
         (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)(short)(uVar4 >> 0x10);
    destination = destination + 1;
  }
  return;
}

Assistant:

void transform_line_to_triplet(const PixelType* source, const size_t pixel_stride_in, triplet<PixelType>* destination,
                               const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    triplet<PixelType>* type_buffer = destination;

    for (size_t i{}; i < pixel_count; ++i)
    {
        type_buffer[i] = transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]);
    }
}